

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nucleus.cxx
# Opt level: O3

void __thiscall
glauber::DeformedWoodsSaxonNucleus::DeformedWoodsSaxonNucleus
          (DeformedWoodsSaxonNucleus *this,size_t A,double R,double a,double beta2,double beta4)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 in_XMM2_Qb;
  undefined8 in_XMM3_Qb;
  undefined1 auVar5 [16];
  allocator_type local_39;
  double local_38;
  double local_30;
  double local_28;
  undefined8 uStack_20;
  double local_18;
  undefined8 uStack_10;
  
  (this->super_Nucleus)._vptr_Nucleus = (_func_int **)&PTR__Nucleus_0013b9f8;
  local_38 = R;
  local_30 = a;
  local_28 = beta2;
  uStack_20 = in_XMM2_Qb;
  local_18 = beta4;
  uStack_10 = in_XMM3_Qb;
  std::vector<glauber::Nucleon,_std::allocator<glauber::Nucleon>_>::vector
            (&(this->super_Nucleus).nucleons_,A,&local_39);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_38;
  auVar1._8_8_ = uStack_20;
  auVar1._0_8_ = local_28;
  auVar3._8_8_ = 0x7fffffffffffffff;
  auVar3._0_8_ = 0x7fffffffffffffff;
  auVar2._8_8_ = uStack_10;
  auVar2._0_8_ = local_18;
  (this->super_Nucleus).offset_ = 0.0;
  (this->super_Nucleus)._vptr_Nucleus = (_func_int **)&PTR__Nucleus_0013bab8;
  this->R_ = local_38;
  this->a_ = local_30;
  this->beta2_ = local_28;
  auVar1 = vandpd_avx(auVar1,auVar3);
  auVar4 = vfmadd213sd_fma(ZEXT816(0x3fe428f5c28f5c29),auVar1,ZEXT816(0x3ff0000000000000));
  auVar1 = vandpd_avx(auVar2,auVar3);
  this->beta4_ = local_18;
  auVar1 = vfmadd132sd_fma(auVar1,auVar4,ZEXT816(0x3feb333333333333));
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_30 * 10.0;
  auVar1 = vfmadd231sd_fma(auVar4,auVar5,auVar1);
  this->rmax_ = auVar1._0_8_;
  return;
}

Assistant:

DeformedWoodsSaxonNucleus::DeformedWoodsSaxonNucleus(
    std::size_t A, double R, double a, double beta2, double beta4)
    : Nucleus(A),
      R_(R),
      a_(a),
      beta2_(beta2),
      beta4_(beta4),
      rmax_(R*(1. + .63*std::fabs(beta2) + .85*std::fabs(beta4)) + 10.*a)
{}